

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::MaskProportionalityCase::iterate(MaskProportionalityCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  TestLog *pTVar3;
  GLenum GVar4;
  long *plVar5;
  size_t sVar6;
  size_type *psVar7;
  Surface *surface;
  int precision;
  int precision_00;
  int precision_01;
  long lVar8;
  void *__buf;
  int iVar9;
  IterateResult IVar10;
  int iVar11;
  qpTestResult testResult;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  CaseType CVar17;
  char *__s;
  Surface renderedImg;
  float local_23c;
  string local_238;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  Surface local_1f8;
  Vec2 local_1e0;
  Vec2 local_1d8;
  Vec2 local_1d0;
  Vec4 local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  pTVar3 = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  iVar16 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_1f8,iVar16,iVar16);
  iVar16 = local_1f8.m_height * local_1f8.m_width;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Clearing color to black",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  glwColorMask('\x01','\x01','\x01','\x01');
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x473);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x474);
  glwClear(0x4000);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x475);
  CVar17 = this->m_type;
  if (CVar17 == CASETYPE_ALPHA_TO_COVERAGE) {
    glwColorMask('\x01','\x01','\x01','\0');
    GVar4 = glwGetError();
    glu::checkError(GVar4,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x479);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Using color mask TRUE, TRUE, TRUE, FALSE",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    CVar17 = this->m_type;
  }
  local_1d0.m_data[0] = 1.0;
  local_1d0.m_data[1] = -1.0;
  local_1d8.m_data[0] = -1.0;
  local_1d8.m_data[1] = 1.0;
  local_1e0.m_data[0] = 1.0;
  local_1e0.m_data[1] = 1.0;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 0.0;
  local_1c8.m_data[2] = 0.0;
  local_1c8.m_data[3] = 1.0;
  local_23c = (float)this->m_currentIteration / (float)(this->m_numIterations + -1);
  if (CVar17 == CASETYPE_ALPHA_TO_COVERAGE) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    de::floatToString_abi_cxx11_((string *)local_218,(de *)0x2,local_23c,precision_00);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x643ba0);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    local_1c8.m_data[3] = local_23c;
  }
  else {
    if (CVar17 == CASETYPE_SAMPLE_COVERAGE_INVERTED) {
      local_23c = 1.0 - local_23c;
    }
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    de::floatToString_abi_cxx11_((string *)local_218,(de *)0x2,local_23c,precision);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x643bc6);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
    pcVar12 = "";
    if (CVar17 == CASETYPE_SAMPLE_COVERAGE_INVERTED) {
      pcVar12 = " (inverted)";
    }
    lVar8 = 0xb;
    if (CVar17 != CASETYPE_SAMPLE_COVERAGE_INVERTED) {
      lVar8 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar12,lVar8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    glwSampleCoverage(local_23c,CVar17 == CASETYPE_SAMPLE_COVERAGE_INVERTED);
    GVar4 = glwGetError();
    glu::checkError(GVar4,"glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x493);
  }
  local_1b0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0xbf800000bf800000;
  local_1b0._8_4_ = 0.0;
  local_238._M_dataplus._M_p = (pointer)0xbf8000003f800000;
  local_238._M_string_length = local_238._M_string_length & 0xffffffff00000000;
  local_218._0_8_ = (pointer)0x3f800000bf800000;
  local_218._8_4_ = 0.0;
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,(Vec3 *)local_1b0,(Vec3 *)&local_238,(Vec3 *)local_218,
             &local_1c8,&local_1c8,&local_1c8);
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,&local_1d8,&local_1d0,&local_1e0,&local_1c8,&local_1c8,
             &local_1c8);
  MultisampleCase::readImage(&this->super_MultisampleCase,&local_1f8);
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"RenderedImage","");
  local_218._0_8_ = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Rendered image","");
  surface = &local_1f8;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_238,(string *)local_218,surface,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf,(size_t)surface);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ != &local_208) {
    operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.m_height < 1) {
    iVar9 = 0;
  }
  else {
    iVar11 = 0;
    iVar13 = 0;
    iVar9 = 0;
    do {
      uVar14 = (ulong)(uint)local_1f8.m_width;
      iVar15 = iVar11;
      if (0 < local_1f8.m_width) {
        do {
          iVar9 = iVar9 + (uint)*(byte *)((long)local_1f8.m_pixels.m_ptr + (long)iVar15 * 4);
          iVar15 = iVar15 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar13 = iVar13 + 1;
      iVar11 = iVar11 + local_1f8.m_width;
    } while (iVar13 != local_1f8.m_height);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Average red color component: ",0x1d);
  de::floatToString_abi_cxx11_
            (&local_238,(de *)0x2,((float)iVar9 / 255.0) / (float)iVar16,precision_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (iVar9 < this->m_previousIterationColorSum) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Failure: Current average red color component is lower than previous",0x43);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00374044:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    pcVar12 = "Failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    iVar11 = this->m_currentIteration;
    if ((iVar11 == 0) && (iVar9 != 0)) {
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Failure: Image should be completely black",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00374044;
    }
    if ((iVar11 == this->m_numIterations + -1) && (iVar9 != iVar16 * 0xff)) {
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Failure: Image should be completely red",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00374044;
    }
    this->m_previousIterationColorSum = iVar9;
    this->m_currentIteration = iVar11 + 1;
    IVar10 = CONTINUE;
    if (iVar11 + 1 < this->m_numIterations) goto LAB_0037407a;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Success: Number of coverage mask bits set appears to be, on average, proportional to "
               ,0x55);
    pcVar12 = "inverted sample coverage value";
    if (this->m_type == CASETYPE_SAMPLE_COVERAGE) {
      pcVar12 = "sample coverage value";
    }
    __s = "alpha";
    if (this->m_type != CASETYPE_ALPHA_TO_COVERAGE) {
      __s = pcVar12;
    }
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,__s,sVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    pcVar12 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  IVar10 = STOP;
  tcu::TestContext::setTestResult
            (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,testResult,pcVar12)
  ;
LAB_0037407a:
  tcu::Surface::~Surface(&local_1f8);
  return IVar10;
}

Assistant:

MaskProportionalityCase::IterateResult MaskProportionalityCase::iterate (void)
{
	TestLog&		log				= m_testCtx.getLog();
	tcu::Surface	renderedImg		(m_viewportSize, m_viewportSize);
	deInt32			numPixels		= (deInt32)renderedImg.getWidth()*(deInt32)renderedImg.getHeight();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE));
		log << TestLog::Message << "Using color mask TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	// Draw quad.

	{
		const Vec2		pt0						(-1.0f, -1.0f);
		const Vec2		pt1						( 1.0f, -1.0f);
		const Vec2		pt2						(-1.0f,  1.0f);
		const Vec2		pt3						( 1.0f,  1.0f);
		Vec4			quadColor				(1.0f, 0.0f, 0.0f, 1.0f);
		float			alphaOrCoverageValue	= (float)m_currentIteration / (float)(m_numIterations-1);

		if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
		{
			log << TestLog::Message << "Drawing a red quad using alpha value " + de::floatToString(alphaOrCoverageValue, 2) << TestLog::EndMessage;
			quadColor.w() = alphaOrCoverageValue;
		}
		else
		{
			DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

			bool	isInverted		= m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED;
			float	coverageValue	= isInverted ? 1.0f - alphaOrCoverageValue : alphaOrCoverageValue;
			log << TestLog::Message << "Drawing a red quad using sample coverage value " + de::floatToString(coverageValue, 2) << (isInverted ? " (inverted)" : "") << TestLog::EndMessage;
			GLU_CHECK_CALL(glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE));
		}

		renderQuad(pt0, pt1, pt2, pt3, quadColor);
	}

	// Read ang log image.

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	// Compute average red component in rendered image.

	deInt32 sumRed = 0;

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
		sumRed += renderedImg.getPixel(x, y).getRed();

	log << TestLog::Message << "Average red color component: " << de::floatToString((float)sumRed / 255.0f / (float)numPixels, 2) << TestLog::EndMessage;

	// Check if average color has decreased from previous frame's color.

	if (sumRed < m_previousIterationColorSum)
	{
		log << TestLog::Message << "Failure: Current average red color component is lower than previous" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	// Check if coverage mask is not all-zeros if alpha or coverage value is 0 (or 1, if inverted).

	if (m_currentIteration == 0 && sumRed != 0)
	{
		log << TestLog::Message << "Failure: Image should be completely black" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	if (m_currentIteration == m_numIterations-1 && sumRed != 0xff*numPixels)
	{
		log << TestLog::Message << "Failure: Image should be completely red" << TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	m_previousIterationColorSum = sumRed;

	m_currentIteration++;

	if (m_currentIteration >= m_numIterations)
	{
		log << TestLog::Message
			<< "Success: Number of coverage mask bits set appears to be, on average, proportional to "
			<< (m_type == CASETYPE_ALPHA_TO_COVERAGE ? "alpha" : m_type == CASETYPE_SAMPLE_COVERAGE ? "sample coverage value" : "inverted sample coverage value")
			<< TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}